

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void __thiscall
RPCResult::RPCResult
          (RPCResult *this,string cond,Type type,string m_key_name,bool optional,string description,
          vector<RPCResult,_std::allocator<RPCResult>_> *inner)

{
  pointer pRVar1;
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  bool in_R8B;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  bool local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_type = (Type)CONCAT71(in_register_00000011,optional);
  std::__cxx11::string::string
            ((string *)&this->m_key_name,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)inner);
  pRVar1 = *(pointer *)(cond._M_dataplus._M_p + 8);
  (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = *(pointer *)cond._M_dataplus._M_p;
  (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar1;
  (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = *(pointer *)(cond._M_dataplus._M_p + 0x10);
  cond._M_dataplus._M_p[0x10] = '\0';
  cond._M_dataplus._M_p[0x11] = '\0';
  cond._M_dataplus._M_p[0x12] = '\0';
  cond._M_dataplus._M_p[0x13] = '\0';
  cond._M_dataplus._M_p[0x14] = '\0';
  cond._M_dataplus._M_p[0x15] = '\0';
  cond._M_dataplus._M_p[0x16] = '\0';
  cond._M_dataplus._M_p[0x17] = '\0';
  cond._M_dataplus._M_p[0] = '\0';
  cond._M_dataplus._M_p[1] = '\0';
  cond._M_dataplus._M_p[2] = '\0';
  cond._M_dataplus._M_p[3] = '\0';
  cond._M_dataplus._M_p[4] = '\0';
  cond._M_dataplus._M_p[5] = '\0';
  cond._M_dataplus._M_p[6] = '\0';
  cond._M_dataplus._M_p[7] = '\0';
  cond._M_dataplus._M_p[8] = '\0';
  cond._M_dataplus._M_p[9] = '\0';
  cond._M_dataplus._M_p[10] = '\0';
  cond._M_dataplus._M_p[0xb] = '\0';
  cond._M_dataplus._M_p[0xc] = '\0';
  cond._M_dataplus._M_p[0xd] = '\0';
  cond._M_dataplus._M_p[0xe] = '\0';
  cond._M_dataplus._M_p[0xf] = '\0';
  this->m_optional = in_R8B;
  this->m_skip_type_check = false;
  std::__cxx11::string::string((string *)&this->m_description,in_R9);
  std::__cxx11::string::string
            ((string *)&this->m_cond,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_register_00000034,type));
  local_39 = (this->m_cond)._M_string_length != 0;
  inline_check_non_fatal<bool>
            (&local_39,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.h",
             0x142,"RPCResult","!m_cond.empty()");
  CheckInnerDoc(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RPCResult(
        std::string cond,
        Type type,
        std::string m_key_name,
        bool optional,
        std::string description,
        std::vector<RPCResult> inner = {})
        : m_type{std::move(type)},
          m_key_name{std::move(m_key_name)},
          m_inner{std::move(inner)},
          m_optional{optional},
          m_skip_type_check{false},
          m_description{std::move(description)},
          m_cond{std::move(cond)}
    {
        CHECK_NONFATAL(!m_cond.empty());
        CheckInnerDoc();
    }